

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  ulonglong uVar7;
  undefined8 extraout_RAX;
  int __oflag;
  char *pcVar8;
  tlc_error_t tVar9;
  char *__format;
  int iVar10;
  long lVar11;
  PARAMETERS params;
  tlc_linecount_t count;
  tlc_string_t errstr;
  CLineCount lc;
  char *local_f8;
  PARAMETERS local_f0;
  tlc_linecount_t local_e0;
  tlc_string_t local_d8;
  CLineCount local_b8;
  
  local_f0.buffersize = 0xffffffffffffffff;
  local_f0.threadcount = -1;
  if (argc == 1) {
    main_cold_7();
    TURBOLINECOUNT::CLineCount::~CLineCount(&local_b8);
    _Unwind_Resume(extraout_RAX);
  }
  bVar3 = false;
  if (argc < 2) {
    local_f8 = (char *)0x0;
  }
  else {
    iVar10 = 1;
    local_f8 = (char *)0x0;
    do {
      pcVar1 = argv[iVar10];
      iVar4 = strcmp(pcVar1,"-h");
      if ((iVar4 == 0) || (iVar4 = strcmp(pcVar1,"--help"), iVar4 == 0)) {
        main_cold_6();
LAB_00102876:
        version();
        exit(0);
      }
      iVar4 = strcmp(pcVar1,"-v");
      if ((iVar4 == 0) || (iVar4 = strcmp(pcVar1,"--version"), iVar4 == 0)) goto LAB_00102876;
      iVar4 = strcmp(pcVar1,"-b");
      bVar2 = bVar3;
      if ((iVar4 == 0) || (iVar4 = strcmp(pcVar1,"--buffersize"), iVar4 == 0)) {
        iVar10 = iVar10 + 1;
        if (iVar10 == argc) {
          pcVar8 = *argv;
          __format = "%s: missing argument to %s\n";
LAB_00102846:
          fprintf(_stderr,__format,pcVar8,pcVar1);
          goto LAB_00102864;
        }
        pcVar1 = argv[iVar10];
        sVar5 = strlen(pcVar1);
        uVar6 = (ulong)((byte)pcVar1[sVar5 - 1] - 0x47);
        if ((byte)pcVar1[sVar5 - 1] - 0x47 < 0x27) {
          if ((0x100000001U >> (uVar6 & 0x3f) & 1) == 0) {
            lVar11 = 0x400;
            if ((0x1000000010U >> (uVar6 & 0x3f) & 1) == 0) {
              if ((0x4000000040U >> (uVar6 & 0x3f) & 1) == 0) goto LAB_0010270a;
              lVar11 = 0x100000;
            }
          }
          else {
            lVar11 = 0x40000000;
          }
        }
        else {
LAB_0010270a:
          lVar11 = 1;
        }
        uVar7 = strtoull(pcVar1,(char **)&local_b8,10);
        local_f0.buffersize = uVar7 * lVar11;
      }
      else {
        iVar4 = strcmp(pcVar1,"-t");
        if ((iVar4 == 0) || (iVar4 = strcmp(pcVar1,"--threadcount"), iVar4 == 0)) {
          iVar10 = iVar10 + 1;
          if (iVar10 == argc) {
            pcVar8 = *argv;
            __format = "%s: Missing argument to %s\n";
            goto LAB_00102846;
          }
          local_f0.threadcount = atoi(argv[iVar10]);
          if (local_f0.threadcount < 1) {
            main_cold_2();
            goto LAB_00102864;
          }
        }
        else {
          local_f8 = pcVar1;
          bVar2 = true;
          if (bVar3) {
            main_cold_1();
            goto LAB_00102864;
          }
        }
      }
      bVar3 = bVar2;
      iVar10 = iVar10 + 1;
    } while (iVar10 < argc);
  }
  if (bVar3) {
    TURBOLINECOUNT::CLineCount::CLineCount(&local_b8,&local_f0);
    iVar10 = TURBOLINECOUNT::CLineCount::open(&local_b8,local_f8,__oflag);
    if ((char)iVar10 == '\0') {
      tVar9 = TURBOLINECOUNT::CLineCount::lastError(&local_b8);
      TURBOLINECOUNT::CLineCount::lastErrorString_abi_cxx11_(&local_d8,&local_b8);
      main_cold_4();
    }
    else {
      bVar3 = TURBOLINECOUNT::CLineCount::countLines(&local_b8,&local_e0);
      if (bVar3) {
        tVar9 = 0;
        printf("%ld\n",local_e0);
      }
      else {
        tVar9 = TURBOLINECOUNT::CLineCount::lastError(&local_b8);
        TURBOLINECOUNT::CLineCount::lastErrorString_abi_cxx11_(&local_d8,&local_b8);
        main_cold_5();
      }
    }
    TURBOLINECOUNT::CLineCount::~CLineCount(&local_b8);
  }
  else {
    main_cold_3();
LAB_00102864:
    tVar9 = 1;
  }
  return tVar9;
}

Assistant:

int main(int argc, char **argv)
#endif
{
	// Parse parameters
	int arg = 1;
	int posparam = 0;
	
	CLineCount::PARAMETERS params;
	params.buffersize = -1;
	params.threadcount = -1;

	TCHAR *filename = NULL;

	if(argc==1)
	{
		help(argv[0]);
		exit(0);
	}

	while (arg < argc)
	{
		if (_tcscmp(argv[arg], _T("-h")) == 0 || _tcscmp(argv[arg], _T("--help")) == 0) 
		{
			help(argv[0]);
			exit(0);
		}
		else if (_tcscmp(argv[arg], _T("-v")) == 0 || _tcscmp(argv[arg], _T("--version")) == 0) 
		{
			version();
			exit(0);
		}
		else if (_tcscmp(argv[arg], _T("-b")) == 0 || _tcscmp(argv[arg], _T("--buffersize")) == 0)
		{
			arg++;
			if (arg == argc)
			{
				_ftprintf(stderr, _T("%s: missing argument to %s\n"), argv[0], argv[arg-1]);
				return 1;
			}

			TCHAR *wsstr = argv[arg];

			// Check for size multipliers			
			size_t multiplier = 1;
			TCHAR *lastchar = wsstr + (_tcslen(wsstr) - 1);
			if (*lastchar == _T('k') || *lastchar == _T('K'))
			{
				multiplier = 1024;
				lastchar = 0;
			}
			else if (*lastchar == _T('m') || *lastchar == _T('M'))
			{
				multiplier = 1024 * 1024;
				lastchar = 0;
			}
			else if (*lastchar == _T('g') || *lastchar == _T('G'))
			{
				multiplier = 1024 * 1024 * 1024;
				lastchar = 0;
			}

			TCHAR *endptr;
			params.buffersize = ((size_t)_tcstoui64(argv[arg], &endptr, 10)) * multiplier;

		}
		else if (_tcscmp(argv[arg], _T("-t")) == 0 || _tcscmp(argv[arg], _T("--threadcount")) == 0)
		{
			arg++;
			if (arg == argc)
			{
				_ftprintf(stderr, _T("%s: Missing argument to %s\n"), argv[0], argv[arg-1]);
				return 1;
			}

			params.threadcount = _ttoi(argv[arg]);
			if(params.threadcount<=0)
			{
				_ftprintf(stderr, _T("%s: Invalid thread count\n"), argv[0]);
				return 1;
			}
		}
		else
		{
			if (posparam == 0)
			{
				filename = argv[arg];
			}
			else
			{
				_ftprintf(stderr, _T("%s: Too many arguments\n"), argv[0]);
				return 1;
			}
			posparam++;
		}

		arg++;
	}

	if (posparam != 1)
	{
		_ftprintf(stderr, _T("%s: Missing required argument\n"), argv[0]);
		return 1;
	}
	
	// Create line count class
	CLineCount lc(&params);

	if (!lc.open(filename))
	{
		tlc_error_t err = lc.lastError();
		tlc_string_t errstr = lc.lastErrorString();

		_ftprintf(stderr, _T("%s: Error %d (%s)\n"), argv[0], err, errstr.c_str());
		return err;
	}

	// Count lines
	tlc_linecount_t count;
	if (!lc.countLines(count))
	{
		tlc_error_t err = lc.lastError();
		tlc_string_t errstr = lc.lastErrorString();

		_ftprintf(stderr, _T("%s: Error %d: (%s)\n"), argv[0], err, errstr.c_str());
		return err;
	}

	// Display output
	_tprintf(_T(TLC_LINECOUNT_FMT) _T("\n"), count);
	
	return 0;
}